

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createConeShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  btConeShape *shape;
  undefined8 in_stack_ffffffffffffffe8;
  
  this_00 = (btCollisionShape *)btConeShape::operator_new(0x187ad9);
  btConeShape::btConeShape
            ((btConeShape *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
             (btScalar)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
             (btScalar)in_stack_ffffffffffffffe8);
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createConeShapeY(btScalar radius,btScalar height)
{
	btConeShape* shape = new btConeShape(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}